

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O1

void __thiscall
slang::ast::PatternCaseStatement::visitStmts<no_old_always_syntax::MainVisitor&>
          (PatternCaseStatement *this,AlwaysFFVisitor *visitor)

{
  size_t sVar1;
  pointer pIVar2;
  long lVar3;
  
  sVar1 = (this->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pIVar2 = (this->items)._M_ptr;
    lVar3 = 0;
    do {
      Statement::visit<no_old_always_syntax::MainVisitor&>
                (*(Statement **)((long)&(pIVar2->stmt).ptr + lVar3),visitor);
      lVar3 = lVar3 + 0x18;
    } while (sVar1 * 0x18 != lVar3);
  }
  if (this->defaultCase != (Statement *)0x0) {
    Statement::visit<no_old_always_syntax::MainVisitor&>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
        if (defaultCase)
            defaultCase->visit(visitor);
    }